

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_table.c
# Opt level: O0

int amqp_decode_array(amqp_bytes_t encoded,amqp_pool_t *pool,amqp_array_t *output,size_t *offset)

{
  amqp_bytes_t encoded_00;
  amqp_bytes_t encoded_01;
  int iVar1;
  uint32_t *__src;
  ulong uVar2;
  void *pvVar3;
  int *in_RCX;
  void *in_RDX;
  amqp_pool_t *in_R8;
  void *newentries;
  int res;
  size_t limit;
  amqp_field_value_t *entries;
  int allocated_entries;
  int num_entries;
  uint32_t arraysize;
  uint32_t *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  size_t in_stack_ffffffffffffffb0;
  void *in_stack_ffffffffffffffb8;
  uint32_t *puVar4;
  undefined4 in_stack_ffffffffffffffc0;
  int iVar5;
  int iVar6;
  uint in_stack_ffffffffffffffcc;
  int local_4;
  
  iVar6 = 0;
  iVar5 = 0x10;
  encoded_00.bytes = in_stack_ffffffffffffffb8;
  encoded_00.len = in_stack_ffffffffffffffb0;
  iVar1 = amqp_decode_32(encoded_00,
                         (size_t *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                         in_stack_ffffffffffffffa0);
  if (iVar1 == 0) {
    local_4 = -2;
  }
  else {
    __src = (uint32_t *)malloc((long)iVar5 * 0x18);
    if (__src == (uint32_t *)0x0) {
      local_4 = -1;
    }
    else {
      uVar2 = in_R8->pagesize + (ulong)in_stack_ffffffffffffffcc;
      while (in_R8->pagesize < uVar2) {
        puVar4 = __src;
        if (iVar5 <= iVar6) {
          iVar5 = iVar5 << 1;
          in_stack_ffffffffffffffa0 = (uint32_t *)realloc(__src,(long)iVar5 * 0x18);
          in_stack_ffffffffffffffac = -1;
          puVar4 = in_stack_ffffffffffffffa0;
          if (in_stack_ffffffffffffffa0 == (uint32_t *)0x0) goto LAB_00115a94;
        }
        encoded_01.bytes = in_RDX;
        encoded_01.len = (size_t)in_RCX;
        in_stack_ffffffffffffffac =
             amqp_decode_field_value
                       (encoded_01,in_R8,
                        (amqp_field_value_t *)CONCAT44(in_stack_ffffffffffffffcc,iVar6),
                        (size_t *)CONCAT44(iVar5,in_stack_ffffffffffffffc0));
        __src = puVar4;
        if (in_stack_ffffffffffffffac < 0) goto LAB_00115a94;
        iVar6 = iVar6 + 1;
      }
      *in_RCX = iVar6;
      pvVar3 = amqp_pool_alloc((amqp_pool_t *)
                               CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                               (size_t)in_stack_ffffffffffffffa0);
      *(void **)(in_RCX + 2) = pvVar3;
      in_stack_ffffffffffffffac = -1;
      if ((*(long *)(in_RCX + 2) != 0) || (iVar6 < 1)) {
        memcpy(*(void **)(in_RCX + 2),__src,(long)iVar6 * 0x18);
        in_stack_ffffffffffffffac = 0;
      }
LAB_00115a94:
      free(__src);
      local_4 = in_stack_ffffffffffffffac;
    }
  }
  return local_4;
}

Assistant:

static int amqp_decode_array(amqp_bytes_t encoded,
                             amqp_pool_t *pool,
                             amqp_array_t *output,
                             size_t *offset)
{
  uint32_t arraysize;
  int num_entries = 0;
  int allocated_entries = INITIAL_ARRAY_SIZE;
  amqp_field_value_t *entries;
  size_t limit;
  int res;

  if (!amqp_decode_32(encoded, offset, &arraysize)) {
    return AMQP_STATUS_BAD_AMQP_DATA;
  }

  entries = malloc(allocated_entries * sizeof(amqp_field_value_t));
  if (entries == NULL) {
    return AMQP_STATUS_NO_MEMORY;
  }

  limit = *offset + arraysize;
  while (*offset < limit) {
    if (num_entries >= allocated_entries) {
      void *newentries;
      allocated_entries = allocated_entries * 2;
      newentries = realloc(entries, allocated_entries * sizeof(amqp_field_value_t));
      res = AMQP_STATUS_NO_MEMORY;
      if (newentries == NULL) {
        goto out;
      }

      entries = newentries;
    }

    res = amqp_decode_field_value(encoded, pool, &entries[num_entries],
                                  offset);
    if (res < 0) {
      goto out;
    }

    num_entries++;
  }

  output->num_entries = num_entries;
  output->entries = amqp_pool_alloc(pool, num_entries * sizeof(amqp_field_value_t));
  res = AMQP_STATUS_NO_MEMORY;
  /* NULL is legitimate if we requested a zero-length block. */
  if (output->entries == NULL && num_entries > 0) {
    goto out;
  }

  memcpy(output->entries, entries, num_entries * sizeof(amqp_field_value_t));
  res = 0;

out:
  free(entries);
  return res;
}